

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::initializeYesterday(Datetime *this,Pig *pig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar4;
  ulong uVar5;
  time_t now;
  string token;
  string local_70;
  string local_50;
  
  previous = Pig::cursor(pig);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"yesterday","");
  bVar3 = Pig::skipPartial(pig,&local_70,&local_50,false);
  sVar2 = local_50._M_string_length;
  if (bVar3) {
    uVar5 = (ulong)minimumMatchLength;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (uVar5 <= sVar2) {
      c = Pig::peek(pig);
      bVar3 = unicodeLatinAlpha(c);
      if (!bVar3) {
        bVar3 = unicodeLatinDigit(c);
        if (!bVar3) {
          local_70._M_dataplus._M_p = (pointer)time((time_t *)0x0);
          __tp = localtime((time_t *)&local_70);
          __tp->tm_sec = 0;
          __tp->tm_min = 0;
          __tp->tm_hour = 0;
          __tp->tm_isdst = -1;
          __tp->tm_mday = __tp->tm_mday + -1;
          tVar4 = mktime(__tp);
          this->_date = tVar4;
          bVar3 = true;
          goto LAB_0010a611;
        }
      }
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Pig::restoreTo(pig,previous);
  bVar3 = false;
LAB_0010a611:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool Datetime::initializeYesterday (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if (pig.skipPartial ("yesterday", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_isdst = -1;
      t->tm_mday -= 1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}